

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixDelete(sqlite3_vfs *NotUsed,char *zPath,int dirSync)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int fd;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  int in_stack_fffffffffffffff4;
  int errcode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  iVar2 = (*aSyscall[0x10].pCurrent)(in_RSI);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 2) {
      local_28 = 0x170a;
    }
    else {
      local_28 = unixLogErrorAtLine(in_stack_fffffffffffffff4,in_RDI,in_RSI,in_EDX);
    }
  }
  else if ((in_EDX & 1) != 0) {
    errcode = -0x55555556;
    iVar2 = (*aSyscall[0x11].pCurrent)(in_RSI,&stack0xfffffffffffffff4);
    if (iVar2 == 0) {
      iVar2 = full_fsync(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffcc);
      local_28 = 0;
      if (iVar2 != 0) {
        local_28 = unixLogErrorAtLine(errcode,in_RDI,in_RSI,in_EDX);
      }
      robust_close((unixFile *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    else {
      local_28 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

static int unixDelete(
  sqlite3_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError(return SQLITE_IOERR_DELETE);
  if( osUnlink(zPath)==(-1) ){
    if( errno==ENOENT
#if OS_VXWORKS
        || osAccess(zPath,0)!=0
#endif
    ){
      rc = SQLITE_IOERR_DELETE_NOENT;
    }else{
      rc = unixLogError(SQLITE_IOERR_DELETE, "unlink", zPath);
    }
    return rc;
  }
#ifndef SQLITE_DISABLE_DIRSYNC
  if( (dirSync & 1)!=0 ){
    int fd;
    rc = osOpenDirectory(zPath, &fd);
    if( rc==SQLITE_OK ){
      if( full_fsync(fd,0,0) ){
        rc = unixLogError(SQLITE_IOERR_DIR_FSYNC, "fsync", zPath);
      }
      robust_close(0, fd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
  }
#endif
  return rc;
}